

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void ErrorMsg(char *filename,int lineno,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (lineno < 1) {
    fprintf(_stderr,"%s: ",filename);
  }
  else {
    fprintf(_stderr,"%s:%d: ",filename,(ulong)(uint)lineno);
  }
  ap[0].reg_save_area = local_c8;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x18;
  ap[0].fp_offset = 0x30;
  vfprintf(_stderr,format,ap);
  fputc(10,_stderr);
  return;
}

Assistant:

void ErrorMsg(const char *filename, int lineno, const char *format, ...){
  va_list ap;

#if _MSC_VER
  if( lineno>0 ){
    fprintf(stderr,"%s(%d) : error : ",filename,lineno);
  }else{
    fprintf(stderr,"%s : error : ",filename);
  }
#else
  if( lineno>0 ){
    fprintf(stderr,"%s:%d: ",filename,lineno);
  }else{
    fprintf(stderr,"%s: ",filename);
  }
#endif
  va_start(ap, format);
  vfprintf(stderr,format,ap);
  va_end(ap);
  fprintf(stderr, "\n");
}